

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O0

int dmrC_lookup_type(token *token)

{
  symbol *psVar1;
  bool local_21;
  symbol *sym;
  token *token_local;
  
  if ((SUB84(token->pos,0) & 0x3f) == 2) {
    psVar1 = dmrC_lookup_symbol((token->field_2).ident,NS_SYMBOL|NS_TYPEDEF);
    local_21 = false;
    if (psVar1 != (symbol *)0x0) {
      local_21 = (*(uint *)psVar1 >> 8 & 2) != 0;
    }
    token_local._4_4_ = (uint)local_21;
  }
  else {
    token_local._4_4_ = 0;
  }
  return token_local._4_4_;
}

Assistant:

static inline int dmrC_lookup_type(struct token *token)
{
	if (token->pos.type == TOKEN_IDENT) {
		struct symbol *sym = dmrC_lookup_symbol(
		    token->ident,
		    (enum namespace_type)(NS_SYMBOL | NS_TYPEDEF));
		return sym && (sym->ns & NS_TYPEDEF);
	}
	return 0;
}